

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Target * GPU_GetWindowTarget(Uint32 windowID)

{
  long lVar1;
  GPU_Target *pGVar2;
  GPU_Target *pGVar3;
  long lVar4;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  pGVar2 = (GPU_Target *)0x0;
  if (windowID != 0) {
    pGVar3 = (GPU_Target *)(ulong)(uint)_gpu_num_window_mappings;
    if (_gpu_num_window_mappings < 1) {
      pGVar3 = pGVar2;
    }
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if ((long)pGVar3 * 0x10 + 0x10 == lVar4 + 0x10) {
        return (GPU_Target *)0x0;
      }
      lVar1 = lVar4 + 0x10;
    } while (*(Uint32 *)((long)&_gpu_window_mappings->windowID + lVar4) != windowID);
    pGVar2 = *(GPU_Target **)((long)&_gpu_window_mappings->target + lVar4);
  }
  return pGVar2;
}

Assistant:

GPU_Target* GPU_GetWindowTarget(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return NULL;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
            return _gpu_window_mappings[i].target;
    }

    return NULL;
}